

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void chrono::XdirToDxDyDz<double>
               (ChVector<double> *Vxdir,ChVector<double> *Vsingular,ChVector<double> *Vx,
               ChVector<double> *Vy,ChVector<double> *Vz)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  dVar13 = Vxdir->m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar13;
  dVar25 = Vxdir->m_data[1];
  dVar33 = Vxdir->m_data[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar33;
  auVar8 = ZEXT816(0) << 0x40;
  if ((((dVar13 != 0.0) || (NAN(dVar13))) || (dVar25 != 0.0)) ||
     (((NAN(dVar25) || (dVar33 != 0.0)) || (NAN(dVar33))))) {
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar25 * dVar25;
    auVar8 = vfmadd231sd_fma(auVar19,auVar14,auVar14);
    auVar8 = vfmadd231sd_fma(auVar8,auVar34,auVar34);
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    bVar5 = 2.2250738585072014e-308 <= auVar8._0_8_;
    dVar36 = 1.0 / auVar8._0_8_;
    dVar33 = (double)((ulong)bVar5 * (long)(dVar33 * dVar36));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)bVar5 * (long)(dVar25 * dVar36);
    auVar9._0_8_ = (ulong)bVar5 * (long)(dVar13 * dVar36) + (ulong)!bVar5 * 0x3ff0000000000000;
    auVar9._8_8_ = 0;
  }
  else {
    auVar9 = ZEXT816(0x3ff0000000000000);
    dVar33 = 0.0;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar33;
  Vx->m_data[0] = auVar9._0_8_;
  Vx->m_data[1] = auVar8._0_8_;
  Vx->m_data[2] = dVar33;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = Vsingular->m_data[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = Vsingular->m_data[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = Vsingular->m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = Vsingular->m_data[0] * auVar8._0_8_;
  auVar14 = vfmsub231sd_fma(auVar15,auVar9,auVar37);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = Vsingular->m_data[2] * auVar9._0_8_;
  auVar34 = vfmsub231sd_fma(auVar26,auVar6,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = Vsingular->m_data[1] * dVar33;
  auVar9 = vfmsub231sd_fma(auVar30,auVar8,auVar39);
  dVar25 = auVar34._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar25 * dVar25;
  auVar8 = vfmadd231sd_fma(auVar20,auVar9,auVar9);
  dVar36 = auVar9._0_8_;
  Vz->m_data[0] = dVar36;
  Vz->m_data[1] = dVar25;
  dVar13 = auVar14._0_8_;
  Vz->m_data[2] = dVar13;
  auVar8 = vfmadd231sd_fma(auVar8,auVar14,auVar14);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  dVar33 = auVar8._0_8_;
  if (dVar33 < 0.0001) {
    auVar21._8_8_ = 0x7fffffffffffffff;
    auVar21._0_8_ = 0x7fffffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = Vsingular->m_data[2];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = Vx->m_data[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = Vx->m_data[0];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = Vx->m_data[2];
    auVar8 = vandpd_avx(auVar21,*(undefined1 (*) [16])Vsingular->m_data);
    auVar4._8_8_ = 0x3feccccccccccccd;
    auVar4._0_8_ = 0x3feccccccccccccd;
    uVar1 = vcmppd_avx512vl(auVar8,auVar4,1);
    auVar8 = vandpd_avx(auVar44,auVar21);
    uVar2 = vcmpsd_avx512f(auVar8,ZEXT816(0x3feccccccccccccd),1);
    uVar7 = (uVar1 & 3) >> 1;
    bVar3 = (byte)(uVar1 & 3);
    dVar13 = (double)((ulong)(bVar3 & 1) * 0x3ff0000000000000);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar13;
    dVar25 = (double)((ulong)!(bool)(bVar3 & 1) * uVar7 * 0x3ff0000000000000);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar25;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar13 * Vx->m_data[1];
    auVar14 = vfmsub231sd_fma(auVar16,auVar40,auVar11);
    dVar13 = auVar14._0_8_;
    dVar33 = (double)((ulong)!SUB81(uVar7,0) *
                     (ulong)!(bool)(bVar3 & 1) * (ulong)((byte)uVar2 & 1) * 0x3ff0000000000000);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar33;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = Vx->m_data[2] * dVar25;
    auVar8 = vfmsub231sd_fma(auVar31,auVar42,auVar12);
    dVar36 = auVar8._0_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar33 * Vx->m_data[0];
    auVar34 = vfmsub231sd_fma(auVar27,auVar43,auVar10);
    dVar25 = auVar34._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar25 * dVar25;
    auVar8 = vfmadd231sd_fma(auVar22,auVar8,auVar8);
    auVar8 = vfmadd231sd_fma(auVar8,auVar14,auVar14);
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar33 = auVar8._0_8_;
  }
  dVar33 = 1.0 / dVar33;
  dVar13 = dVar33 * dVar13;
  dVar25 = dVar33 * dVar25;
  dVar33 = dVar33 * dVar36;
  Vz->m_data[0] = dVar33;
  Vz->m_data[1] = dVar25;
  Vz->m_data[2] = dVar13;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = Vx->m_data[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = Vx->m_data[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = Vx->m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar33;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = Vx->m_data[0] * dVar25;
  auVar8 = vfmsub231sd_fma(auVar38,auVar23,auVar35);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar13;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = Vx->m_data[2] * dVar33;
  auVar14 = vfmsub231sd_fma(auVar24,auVar17,auVar32);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = Vx->m_data[1] * dVar13;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar25;
  auVar34 = vfmsub231sd_fma(auVar18,auVar28,auVar41);
  Vy->m_data[0] = auVar34._0_8_;
  Vy->m_data[1] = auVar14._0_8_;
  Vy->m_data[2] = auVar8._0_8_;
  return;
}

Assistant:

inline bool ChVector<Real>::operator==(const ChVector<Real>& other) const {
    return other.m_data[0] == m_data[0] && other.m_data[1] == m_data[1] && other.m_data[2] == m_data[2];
}